

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void __thiscall ON_SHA1::set_final_hash(ON_SHA1 *this)

{
  uint uVar1;
  ON__UINT8 local_22 [8];
  ON__UINT8 byte_00;
  ON__UINT8 byte_80;
  ON__UINT8 pbFinalCount [8];
  ON__UINT32 bit_count;
  ON__UINT32 i;
  ON_SHA1 *this_local;
  
  uVar1 = this->m_bit_count[1];
  pbFinalCount[4] = '\0';
  pbFinalCount[5] = '\0';
  pbFinalCount[6] = '\0';
  pbFinalCount[7] = '\0';
  for (; (uint)pbFinalCount._4_4_ < 4; pbFinalCount._4_4_ = pbFinalCount._4_4_ + 1) {
    local_22[(ulong)(uint)pbFinalCount._4_4_ + 2] =
         (ON__UINT8)(uVar1 >> (('\x03' - ((byte)pbFinalCount._4_4_ & 3)) * '\b' & 0x1f));
  }
  pbFinalCount._0_4_ = this->m_bit_count[0];
  pbFinalCount[4] = '\x04';
  pbFinalCount[5] = '\0';
  pbFinalCount[6] = '\0';
  pbFinalCount[7] = '\0';
  for (; (uint)pbFinalCount._4_4_ < 8; pbFinalCount._4_4_ = pbFinalCount._4_4_ + 1) {
    local_22[(ulong)(uint)pbFinalCount._4_4_ + 2] =
         (ON__UINT8)
         ((uint)pbFinalCount._0_4_ >> (('\x03' - ((byte)pbFinalCount._4_4_ & 3)) * '\b' & 0x1f));
  }
  local_22[1] = 0x80;
  Internal_Accumulate(this,local_22 + 1,1);
  local_22[0] = '\0';
  while ((this->m_bit_count[0] & 0x1f8) != 0x1c0) {
    Internal_Accumulate(this,local_22,1);
  }
  Internal_Accumulate(this,local_22 + 2,8);
  pbFinalCount[4] = '\0';
  pbFinalCount[5] = '\0';
  pbFinalCount[6] = '\0';
  pbFinalCount[7] = '\0';
  for (; (uint)pbFinalCount._4_4_ < 0x14; pbFinalCount._4_4_ = pbFinalCount._4_4_ + 1) {
    (this->m_sha1_hash).m_digest[(uint)pbFinalCount._4_4_] =
         (ON__UINT8)
         (this->m_state[(uint)pbFinalCount._4_4_ >> 2] >>
         (('\x03' - ((byte)pbFinalCount._4_4_ & 3)) * '\b' & 0x1f));
  }
  return;
}

Assistant:

void ON_SHA1::set_final_hash()
{
  ON__UINT32 i;
  ON__UINT32 bit_count;
  ON__UINT8 pbFinalCount[8];
  bit_count = m_bit_count[1];
  for (i = 0; i < 4; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent
  bit_count = m_bit_count[0];
  for (i = 4; i < 8; ++i)
    pbFinalCount[i] = static_cast<ON__UINT8>((bit_count >> ((3 - (i & 3)) * 8)) & 0xFF); // Endian independent

  //update((ON__UINT8*)"\200", 1);
  const ON__UINT8 byte_80 = 0x80U;
  Internal_Accumulate(&byte_80, 1);

  const ON__UINT8 byte_00 = 0U;
  while ((m_bit_count[0] & 504) != 448)
    Internal_Accumulate(&byte_00, 1);
    //Internal_Accumulate((ON__UINT8*)"\0", 1);

  Internal_Accumulate(pbFinalCount, 8); // Cause a transform()

  for (i = 0; i < 20; ++i)
    m_sha1_hash.m_digest[i] = static_cast<ON__UINT8>((m_state[i >> 2] >> ((3 - (i & 3)) * 8)) & 0xFF);
}